

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping.c
# Opt level: O0

int mpt_mapping_cmp(mpt_mapping *map,mpt_valsrc *src,int cli)

{
  int cli_local;
  mpt_valsrc *src_local;
  mpt_mapping *map_local;
  
  if ((cli < 0) || ((uint)map->client == cli)) {
    if ((map->src).dim == src->dim) {
      if (((map->src).state & src->state) == 0) {
        map_local._4_4_ = 1;
      }
      else {
        map_local._4_4_ = 0;
      }
    }
    else {
      map_local._4_4_ = -2;
    }
  }
  else {
    map_local._4_4_ = -1;
  }
  return map_local._4_4_;
}

Assistant:

int mpt_mapping_cmp(const MPT_STRUCT(mapping) *map, const MPT_STRUCT(valsrc) *src, int cli)
{
	if (cli >= 0 && (map->client != cli)) {
		return -1;
	}
	if (map->src.dim != src->dim) {
		return -2;
	}
	if (map->src.state & src->state) {
		return 0;
	}
	return 1;
}